

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_watcher.hpp
# Opt level: O3

void __thiscall vfs::posix_watcher::run(posix_watcher *this,bool folders,bool files)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined8 uVar4;
  void *unaff_RBX;
  value_type *__val;
  int iVar5;
  long lVar6;
  string local_e8;
  _union_1457 local_c8;
  sigset_t local_c0;
  
  local_c8.sa_handler = (__sighandler_t)0x0;
  sigemptyset(&local_c0);
  sigaction(10,(sigaction *)&local_c8,(sigaction *)0x0);
  if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0013b208:
    uVar4 = std::__throw_bad_function_call();
    operator_delete(unaff_RBX,0x1000);
    _Unwind_Resume(uVar4);
  }
  (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&this->dir_);
  unaff_RBX = operator_new(0x1000);
  memset(unaff_RBX,0,0x1000);
  if (((this->running_)._M_base._M_i & 1U) != 0) {
    while (sVar2 = read(this->inotifyFd_,unaff_RBX,0x1000), sVar2 != -1) {
      if (0 < sVar2) {
        lVar6 = 0;
        iVar5 = 0;
        do {
          uVar1 = *(uint *)((long)unaff_RBX + lVar6 + 4);
          if ((short)uVar1 < 0) {
            if (((this->running_)._M_base._M_i & 1U) == 0) goto LAB_0013b1ba;
          }
          else if ((uVar1 >> 0x1e & 1) == 0) {
            if (*(int *)((long)unaff_RBX + lVar6 + 0xc) != 0 && files) {
LAB_0013b18a:
              if ((this->callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
                goto LAB_0013b208;
              }
              (*(this->callback_)._M_invoker)((_Any_data *)&this->callback_,&this->dir_);
            }
          }
          else if (folders) goto LAB_0013b18a;
          iVar5 = iVar5 + *(int *)((long)unaff_RBX + lVar6 + 0xc) + 0x10;
          lVar6 = (long)iVar5;
        } while (lVar6 < sVar2);
      }
      if (((this->running_)._M_base._M_i & 1U) == 0) goto LAB_0013b1ba;
    }
    piVar3 = __errno_location();
    get_last_error_as_string_abi_cxx11_(&local_e8,*piVar3);
    run();
  }
LAB_0013b1ba:
  operator_delete(unaff_RBX,0x1000);
  return;
}

Assistant:

void run(bool folders, bool files)
        {
            // This is set up to end the thread if killed by SIGUSR1.
            struct sigaction sa;
            sa.sa_handler   = nullptr;
            sa.sa_sigaction = nullptr;
            sigemptyset(&sa.sa_mask);
            sigaction(SIGUSR1, &sa, nullptr);

            // Call the callback in case we have some folders in there waiting before we started the process
            callback_(dir_);

            constexpr auto maxNumEventsToRead   = 128;
            constexpr auto eventSize            = sizeof(struct inotify_event);
            constexpr auto bufferLength         = maxNumEventsToRead*(eventSize+16);
            auto eventBuffer                    = std::vector<uint8_t>(bufferLength);

            while (running_)
            {
                // Multiple events can be read at a time.
                auto eventBufferOffset = 0;

                // Will block until a new event takes place.
                const auto sizeReadInBytes = read(inotifyFd_, eventBuffer.data(), bufferLength);
                if(sizeReadInBytes == -1)
                {
                    vfs_errorf("read() of inotify file descriptor failed with error: %s",
                               get_last_error_as_string(errno).c_str());
                    return;
                }

                while (eventBufferOffset < sizeReadInBytes)
                {
                    const auto pEvent = reinterpret_cast<struct inotify_event *>(&eventBuffer[eventBufferOffset]);

                    if ((pEvent->mask & IN_IGNORED) != 0)
                    {
                        // IN_IGNORED is set when the caller thread removes watch.
                        // This can also happen when the watched file/directory was deleted
                        // or the filesystem was unmounted.
                        if(running_ == false)
                        {
                            return;
                        }
                    }
                    else if((pEvent->mask & IN_ISDIR) != 0)
                    {
                        if (folders)
                        {
                            // A directory has been created/deleted.
                            callback_(dir_);
                        }
                    }
                    else if (pEvent->len != 0)
                    {
                        if (files)
                        {
                            // A file has been created/deleted.
                            callback_(dir_);
                        }
                    }

                    eventBufferOffset += eventSize + pEvent->len;
                }
            }
        }